

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

void duckdb_je_ckh_pointer_hash(void *key,size_t *r_hash)

{
  anon_union_8_2_9473010e u;
  
  u.v = key;
  hash(&u,8,0xd983396e,r_hash);
  return;
}

Assistant:

void
ckh_pointer_hash(const void *key, size_t r_hash[2]) {
	union {
		const void	*v;
		size_t		i;
	} u;

	assert(sizeof(u.v) == sizeof(u.i));
	u.v = key;
	hash(&u.i, sizeof(u.i), 0xd983396eU, r_hash);
}